

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

xmlAutomataStatePtr
xmlAutomataNewCountTrans
          (xmlAutomataPtr am,xmlAutomataStatePtr from,xmlAutomataStatePtr to,xmlChar *token,int min,
          int max,void *data)

{
  xmlRegCounter *pxVar1;
  int iVar2;
  xmlRegAtomPtr atom;
  xmlChar *pxVar3;
  
  if (((-1 < min && token != (xmlChar *)0x0) &&
       (from != (xmlAutomataStatePtr)0x0 && am != (xmlAutomataPtr)0x0)) && (0 < max && min <= max))
  {
    atom = (xmlRegAtomPtr)(*xmlMalloc)(0x60);
    if (atom != (xmlRegAtomPtr)0x0) {
      atom->no = 0;
      atom->type = 0;
      atom->quant = 0;
      atom->min = 0;
      atom->ranges = (xmlRegRangePtr *)0x0;
      atom->data = (void *)0x0;
      atom->stop = (xmlRegStatePtr)0x0;
      atom->maxRanges = 0;
      atom->nbRanges = 0;
      atom->start = (xmlRegStatePtr)0x0;
      atom->start0 = (xmlRegStatePtr)0x0;
      atom->valuep2 = (void *)0x0;
      atom->neg = 0;
      atom->codepoint = 0;
      *(undefined8 *)&atom->max = 0;
      atom->valuep = (void *)0x0;
      atom->type = XML_REGEXP_STRING;
      atom->quant = XML_REGEXP_QUANT_ONCE;
      pxVar3 = xmlStrdup(token);
      atom->valuep = pxVar3;
      atom->data = data;
      iVar2 = 1;
      if (min != 0) {
        iVar2 = min;
      }
      atom->min = iVar2;
      atom->max = max;
      iVar2 = xmlRegGetCounter(am);
      pxVar1 = am->counters;
      pxVar1[iVar2].min = min;
      pxVar1[iVar2].max = max;
      if (to == (xmlAutomataStatePtr)0x0) {
        to = (xmlAutomataStatePtr)(*xmlMalloc)(0x38);
        if (to == (xmlRegStatePtr)0x0) {
          xmlRegexpErrMemory(am,"allocating state");
        }
        else {
          to->maxTransTo = 0;
          to->nbTransTo = 0;
          to->transTo = (int *)0x0;
          *(undefined8 *)&to->nbTrans = 0;
          to->trans = (xmlRegTrans *)0x0;
          to->markd = XML_REGEXP_MARK_NORMAL;
          to->reached = XML_REGEXP_MARK_NORMAL;
          to->no = 0;
          to->maxTrans = 0;
          to->type = XML_REGEXP_TRANS_STATE;
          to->mark = XML_REGEXP_MARK_NORMAL;
        }
        xmlRegStatePush(am,to);
      }
      xmlRegStateAddTrans(am,from,atom,to,iVar2,-1);
      xmlRegAtomPush(am,atom);
      am->state = to;
      if (to == (xmlRegStatePtr)0x0 || min != 0) {
        return to;
      }
      xmlRegStateAddTrans(am,from,(xmlRegAtomPtr)0x0,to,-1,-1);
      return to;
    }
    xmlRegexpErrMemory(am,"allocating atom");
  }
  return (xmlAutomataStatePtr)0x0;
}

Assistant:

xmlAutomataStatePtr
xmlAutomataNewCountTrans(xmlAutomataPtr am, xmlAutomataStatePtr from,
			 xmlAutomataStatePtr to, const xmlChar *token,
			 int min, int max, void *data) {
    xmlRegAtomPtr atom;
    int counter;

    if ((am == NULL) || (from == NULL) || (token == NULL))
	return(NULL);
    if (min < 0)
	return(NULL);
    if ((max < min) || (max < 1))
	return(NULL);
    atom = xmlRegNewAtom(am, XML_REGEXP_STRING);
    if (atom == NULL)
	return(NULL);
    atom->valuep = xmlStrdup(token);
    atom->data = data;
    if (min == 0)
	atom->min = 1;
    else
	atom->min = min;
    atom->max = max;

    /*
     * associate a counter to the transition.
     */
    counter = xmlRegGetCounter(am);
    am->counters[counter].min = min;
    am->counters[counter].max = max;

    /* xmlFAGenerateTransitions(am, from, to, atom); */
    if (to == NULL) {
        to = xmlRegNewState(am);
	xmlRegStatePush(am, to);
    }
    xmlRegStateAddTrans(am, from, atom, to, counter, -1);
    xmlRegAtomPush(am, atom);
    am->state = to;

    if (to == NULL)
	to = am->state;
    if (to == NULL)
	return(NULL);
    if (min == 0)
	xmlFAGenerateEpsilonTransition(am, from, to);
    return(to);
}